

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStack.cpp
# Opt level: O1

bool __thiscall JSON::JSONStack::Push(JSONStack *this,Var data,bool bJsObject)

{
  RealCount *pRVar1;
  int iVar2;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
  *pLVar3;
  Type pSVar4;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,bJsObject) == 0) {
    EnsuresDomObjectStack(this);
    if (this->tempValues[1] != (Var)0x0) {
      pLVar3 = this->domObjectStack;
      JsUtil::
      List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ::EnsureArray(pLVar3,0);
      iVar2 = (pLVar3->
              super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
              ).count;
      (pLVar3->
      super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ).buffer[iVar2] = this->tempValues[1];
      (pLVar3->
      super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ).count = iVar2 + 1;
      this->tempValues[1] = (Var)0x0;
    }
    pLVar3 = this->domObjectStack;
    if ((pLVar3->
        super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
        ).count == 0) {
      this->tempValues[1] = data;
    }
    else {
      JsUtil::
      List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ::EnsureArray(pLVar3,0);
      iVar2 = (pLVar3->
              super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
              ).count;
      (pLVar3->
      super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ).buffer[iVar2] = data;
      (pLVar3->
      super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ).count = iVar2 + 1;
    }
  }
  else {
    if (this->tempValues[0] != (Var)0x0) {
      pSVar4 = (Type)new<Memory::ArenaAllocator>(0x10,(this->jsObjectStack).allocator,0x366bee);
      pSVar4[1].next = (Type)this->tempValues[0];
      pSVar4->next = (this->jsObjectStack).
                     super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (this->jsObjectStack).super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
      pRVar1 = &(this->jsObjectStack).super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      this->tempValues[0] = (Var)0x0;
    }
    if ((this->jsObjectStack).super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
        super_RealCount.count == 0) {
      this->tempValues[0] = data;
    }
    else {
      pSVar4 = (Type)new<Memory::ArenaAllocator>(0x10,(this->jsObjectStack).allocator,0x366bee);
      pSVar4[1].next = (Type)data;
      pSVar4->next = (this->jsObjectStack).
                     super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (this->jsObjectStack).super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
      pRVar1 = &(this->jsObjectStack).super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
  }
  return true;
}

Assistant:

bool JSONStack::Push(Js::Var data, bool bJsObject)
    {
        if (bJsObject)
        {
            bool result = true;
            if (_JS_VALUE)
            {
                jsObjectStack.Push(_JS_VALUE);
                _JS_VALUE = nullptr;
            }

            if (jsObjectStack.Count())
            {
                result = jsObjectStack.Push(data);
            }
            else
            {
                _JS_VALUE = data;
            }

            return result;
        }

        EnsuresDomObjectStack();

        if (_DOM_VALUE)
        {
            domObjectStack->Add(_DOM_VALUE);
            _DOM_VALUE = nullptr;
        }

        if (domObjectStack->Count())
        {
            domObjectStack->Add(data);
        }
        else
        {
            _DOM_VALUE = data;
        }
        return true;
    }